

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O2

void __thiscall
duckdb::TemporaryFileManager::WriteTemporaryBuffer
          (TemporaryFileManager *this,block_id_t block_id,FileBuffer *buffer)

{
  FileBuffer *buffer_00;
  idx_t iVar1;
  TemporaryBufferSize size;
  temporary_file_map_t *ptVar2;
  pointer this_00;
  mapped_type *this_01;
  TemporaryFileHandle *pTVar3;
  mapped_type *pmVar4;
  TemporaryFileCompressionAdaptivity *compression_adaptivity;
  __node_base *p_Var5;
  CompressionResult CVar6;
  TemporaryFileIndex index;
  TemporaryFileManagerLock lock;
  CompressionResult compression_result;
  AllocatedData compressed_buffer;
  TemporaryFileIdentifier identifier;
  TemporaryFileIndex local_c8;
  TemporaryFileManagerLock local_b0;
  _Head_base<0UL,_duckdb::TemporaryFileHandle_*,_false> local_a8;
  TemporaryBufferSize local_a0;
  TemporaryCompressionLevel local_98;
  int64_t local_90;
  TemporaryFileCompressionAdaptivity *local_88;
  FileBuffer *local_80;
  TemporaryFileIndex local_78;
  block_id_t local_60;
  AllocatedData local_58;
  TemporaryFileIdentifier local_40;
  
  local_60 = block_id;
  iVar1 = TaskScheduler::GetEstimatedCPUId();
  compression_adaptivity = (this->compression_adaptivities)._M_elems + ((uint)iVar1 & 0x3f);
  local_90 = ::std::chrono::_V2::system_clock::now();
  AllocatedData::AllocatedData(&local_58);
  local_88 = compression_adaptivity;
  CVar6 = CompressBuffer(this,compression_adaptivity,buffer,&local_58);
  size = CVar6.size;
  local_98 = CVar6.level;
  local_a0 = size;
  TemporaryFileIndex::TemporaryFileIndex(&local_c8);
  TemporaryFileManagerLock::TemporaryFileManagerLock(&local_b0,&this->manager_lock);
  local_80 = buffer;
  ptVar2 = TemporaryFileMap::GetMapForSize(&this->files,size);
  p_Var5 = &(ptVar2->_M_h)._M_before_begin;
  do {
    p_Var5 = p_Var5->_M_nxt;
    if (p_Var5 == (__node_base *)0x0) goto LAB_01ad10ac;
    this_00 = unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>
              ::operator->((unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>
                            *)(p_Var5 + 2));
    TemporaryFileHandle::TryGetBlockIndex(&local_78,this_00);
    local_c8.block_index.index = local_78.block_index.index;
    local_c8.identifier.size = local_78.identifier.size;
    local_c8.identifier.file_index.index = local_78.identifier.file_index.index;
  } while (((local_78.identifier.size == INVALID) ||
           (local_78.identifier.file_index.index == 0xffffffffffffffff)) ||
          (local_78.block_index.index == 0xffffffffffffffff));
  local_a8._M_head_impl =
       (((unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>_>
          *)&((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor)->_M_t).
       super___uniq_ptr_impl<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::TemporaryFileHandle_*,_std::default_delete<duckdb::TemporaryFileHandle>_>
       .super__Head_base<0UL,_duckdb::TemporaryFileHandle_*,_false>._M_head_impl;
  if (local_a8._M_head_impl == (TemporaryFileHandle *)0x0) {
LAB_01ad10ac:
    this_01 = ::std::__detail::
              _Map_base<duckdb::TemporaryBufferSize,_std::pair<const_duckdb::TemporaryBufferSize,_duckdb::BlockIndexManager>,_std::allocator<std::pair<const_duckdb::TemporaryBufferSize,_duckdb::BlockIndexManager>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TemporaryBufferSize>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<duckdb::TemporaryBufferSize,_std::pair<const_duckdb::TemporaryBufferSize,_duckdb::BlockIndexManager>,_std::allocator<std::pair<const_duckdb::TemporaryBufferSize,_duckdb::BlockIndexManager>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TemporaryBufferSize>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->index_managers,&local_a0);
    iVar1 = BlockIndexManager::GetNewBlockIndex(this_01,local_a0);
    TemporaryFileIdentifier::TemporaryFileIdentifier(&local_40,size,iVar1);
    pTVar3 = TemporaryFileMap::CreateFile(&this->files,&local_40);
    TemporaryFileHandle::TryGetBlockIndex(&local_78,pTVar3);
    local_c8.block_index.index = local_78.block_index.index;
    local_c8.identifier.size = local_78.identifier.size;
    local_c8.identifier.file_index.index = local_78.identifier.file_index.index;
    local_a8._M_head_impl = pTVar3;
  }
  pmVar4 = ::std::__detail::
           _Map_base<long,_std::pair<const_long,_duckdb::TemporaryFileIndex>,_std::allocator<std::pair<const_long,_duckdb::TemporaryFileIndex>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<long,_std::pair<const_long,_duckdb::TemporaryFileIndex>,_std::allocator<std::pair<const_long,_duckdb::TemporaryFileIndex>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->used_blocks,&local_60);
  (pmVar4->block_index).index = local_c8.block_index.index;
  (pmVar4->identifier).size = local_c8.identifier.size;
  (pmVar4->identifier).file_index.index = local_c8.identifier.file_index.index;
  pthread_mutex_unlock((pthread_mutex_t *)local_b0.lock._M_device);
  pTVar3 = optional_ptr<duckdb::TemporaryFileHandle,_true>::operator->
                     ((optional_ptr<duckdb::TemporaryFileHandle,_true> *)&local_a8);
  buffer_00 = local_80;
  iVar1 = optional_idx::GetIndex(&local_c8.block_index);
  TemporaryFileHandle::WriteTemporaryBuffer(pTVar3,buffer_00,iVar1,&local_58);
  TemporaryFileCompressionAdaptivity::Update(local_88,local_98,local_90);
  AllocatedData::~AllocatedData(&local_58);
  return;
}

Assistant:

void TemporaryFileManager::WriteTemporaryBuffer(block_id_t block_id, FileBuffer &buffer) {
	// We group DEFAULT_BLOCK_ALLOC_SIZE blocks into the same file.
	D_ASSERT(buffer.AllocSize() == BufferManager::GetBufferManager(db).GetBlockAllocSize());

	const auto adaptivity_idx = TaskScheduler::GetEstimatedCPUId() % COMPRESSION_ADAPTIVITIES;
	auto &compression_adaptivity = compression_adaptivities[adaptivity_idx];

	const auto time_before_ns = TemporaryFileCompressionAdaptivity::GetCurrentTimeNanos();
	AllocatedData compressed_buffer;
	const auto compression_result = CompressBuffer(compression_adaptivity, buffer, compressed_buffer);

	TemporaryFileIndex index;
	optional_ptr<TemporaryFileHandle> handle;
	{
		TemporaryFileManagerLock lock(manager_lock);
		// first check if we can write to an open existing file
		for (auto &entry : files.GetMapForSize(compression_result.size)) {
			auto &temp_file = entry.second;
			index = temp_file->TryGetBlockIndex();
			if (index.IsValid()) {
				handle = entry.second.get();
				break;
			}
		}
		if (!handle) {
			// no existing handle to write to; we need to create & open a new file
			auto &size = compression_result.size;
			const TemporaryFileIdentifier identifier(size, index_managers[size].GetNewBlockIndex(size));
			auto &new_file = files.CreateFile(identifier);
			index = new_file.TryGetBlockIndex();
			handle = &new_file;
		}
		D_ASSERT(used_blocks.find(block_id) == used_blocks.end());
		used_blocks[block_id] = index;
	}
	D_ASSERT(handle);
	D_ASSERT(index.IsValid());

	handle->WriteTemporaryBuffer(buffer, index.block_index.GetIndex(), compressed_buffer);

	compression_adaptivity.Update(compression_result.level, time_before_ns);
}